

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NameKind in_R9D;
  string_view name;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  AlphaNum local_78;
  AlphaNum local_48;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  if (*(cpp **)(this + 0x20) != (cpp *)0x0) {
    ClassName_abi_cxx11_(&local_98,*(cpp **)(this + 0x20),descriptor);
    local_78.piece_._M_len = local_98._M_string_length;
    local_78.piece_._M_str = local_98._M_dataplus._M_p;
    local_48.piece_._M_len = 1;
    local_48.piece_._M_str = "_";
    absl::lts_20250127::StrAppend(&local_b8,&local_78,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  local_78.piece_._M_len = (size_t)**(ushort **)(this + 0x10);
  local_78.piece_._M_str = (char *)(~local_78.piece_._M_len + (long)*(ushort **)(this + 0x10));
  absl::lts_20250127::StrAppend(&local_b8,&local_78);
  if (*(char *)(*(long *)(this + 0x28) + 0x53) == '\x01') {
    local_78.piece_._M_len = 9;
    local_78.piece_._M_str = "_DoNotUse";
    absl::lts_20250127::StrAppend(&local_b8,&local_78);
  }
  name._M_str = (char *)0x0;
  name._M_len = (size_t)local_b8._M_dataplus._M_p;
  ResolveKnownNameCollisions_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_b8._M_string_length,name,kFile,in_R9D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const Descriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  std::string res;
  if (parent) absl::StrAppend(&res, ClassName(parent), "_");
  absl::StrAppend(&res, descriptor->name());
  if (IsMapEntryMessage(descriptor)) absl::StrAppend(&res, "_DoNotUse");
  // This is the mangled message name which always goes in file scope.
  return ResolveKnownNameCollisions(res, NameContext::kFile, NameKind::kType);
}